

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffcpky(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,char *rootname,int *status)

{
  int iVar1;
  int tstatus;
  char value [71];
  char comment [73];
  char keyname [75];
  char card [81];
  int local_184;
  fitsfile *local_180;
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_184 = 0;
  local_180 = outfptr;
  ffkeyn(rootname,incol,local_d8,&local_184);
  iVar1 = ffgkey(infptr,local_d8,local_178,local_128,&local_184);
  if (iVar1 < 1) {
    ffkeyn(rootname,outcol,local_d8,&local_184);
    ffmkky(local_d8,local_178,local_128,local_88,status);
    ffprec(local_180,local_88,status);
  }
  return *status;
}

Assistant:

int ffcpky(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - input index number   */
           int outcol,          /* I - output index number  */
           char *rootname,      /* I - root name of the keyword to be copied */
           int *status)         /* IO - error status     */
/*
  copy an indexed keyword from infptr to outfptr.
*/
{
    int tstatus = 0;
    char keyname[FLEN_KEYWORD];
    char value[FLEN_VALUE], comment[FLEN_COMMENT], card[FLEN_CARD];

    ffkeyn(rootname, incol, keyname, &tstatus);
    if (ffgkey(infptr, keyname, value, comment, &tstatus) <= 0)
    {
        ffkeyn(rootname, outcol, keyname, &tstatus);
        ffmkky(keyname, value, comment, card, status);
        ffprec(outfptr, card, status);
    }
    return(*status);
}